

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_timedwait.c
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *format;
  ALLEGRO_EVENT event;
  ALLEGRO_TIMEOUT timeout;
  float local_74;
  int local_70 [8];
  int local_50;
  undefined1 local_28 [16];
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    lVar4 = al_create_display(0x280,0x1e0);
    if (lVar4 != 0) {
      uVar5 = al_create_event_queue();
      uVar6 = al_get_keyboard_event_source();
      al_register_event_source(uVar5,uVar6);
      local_74 = 0.1;
      do {
        cVar2 = al_wait_for_event_timed(0x3dcccccd,uVar5,local_70);
        if (cVar2 == '\0') {
          local_74 = local_74 + 0.1;
          if (1.0 < local_74) {
            local_74 = 1.0;
          }
        }
        else if ((local_70[0] == 10) && (local_74 = 0.1, local_50 == 0x3b)) {
          local_74 = 0.1;
          do {
            al_init_timeout(0x3fb999999999999a,local_28);
            while( true ) {
              cVar2 = al_wait_for_event_until(uVar5,local_70,local_28);
              if (cVar2 == '\0') break;
              if (local_70[0] == 10) {
                local_74 = 0.1;
                if (local_50 == 0x3b) {
                  return 0;
                }
              }
            }
            fVar1 = local_74 + 0.1;
            local_74 = 1.0;
            if (fVar1 <= 1.0) {
              local_74 = fVar1;
            }
            al_map_rgba_f(local_74,local_74 * 0.5,local_74 * 0.25,0);
            al_clear_to_color();
            al_flip_display();
          } while( true );
        }
        al_map_rgba_f(local_74 * 0.5,local_74 * 0.25,local_74,0);
        al_clear_to_color();
        al_flip_display();
      } while( true );
    }
    format = "Unable to set any graphic mode\n";
  }
  abort_example(format);
  iVar3 = __cxa_atexit();
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *dpy;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();

   dpy = al_create_display(640, 480);
   if (!dpy) {
      abort_example("Unable to set any graphic mode\n");
   }

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   test_relative_timeout(queue);
   test_absolute_timeout(queue);

   return 0;
}